

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenastring_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::SingleArena_CopyConstructEmpty_Test::TestBody
          (SingleArena_CopyConstructEmpty_Test *this)

{
  _func_int *message;
  unique_ptr<google::protobuf::Arena,_std::default_delete<google::protobuf::Arena>_> arena;
  ArenaStringPtr dst;
  ArenaStringPtr field;
  string empty;
  AssertHelper AStack_68;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_60;
  undefined1 local_58 [8];
  internal local_50 [8];
  WithParamInterface<bool> local_48;
  ArenaStringPtr local_40;
  ArenaStringPtr local_38;
  _Alloc_hider local_30;
  size_type local_28;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_20;
  
  local_28 = 0;
  local_20._M_local_buf[0] = '\0';
  local_30._M_p = (pointer)&local_20;
  SingleArena::GetArena((SingleArena *)local_58);
  local_40.tagged_ptr_.ptr_ = (TaggedStringPtr)&local_30;
  message = (_func_int *)(anon_var_dwarf_a22956 + 5);
  local_38.tagged_ptr_.ptr_ = local_40.tagged_ptr_.ptr_;
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[1]>
            (local_50,"dst.Get()","\"\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             local_40.tagged_ptr_.ptr_,(char (*) [1])(anon_var_dwarf_a22956 + 5));
  if (local_50[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_60);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        local_48._vptr_WithParamInterface !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = *local_48._vptr_WithParamInterface;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arenastring_unittest.cc"
               ,0x8a,(char *)message);
    testing::internal::AssertHelper::operator=(&AStack_68,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&AStack_68);
    if (local_60._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_60._M_head_impl + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      local_48._vptr_WithParamInterface !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_48,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_48._vptr_WithParamInterface);
  }
  if (local_58 == (undefined1  [8])0x0) {
    protobuf::internal::ArenaStringPtr::Destroy(&local_40);
  }
  protobuf::internal::ArenaStringPtr::Destroy(&local_38);
  std::unique_ptr<google::protobuf::Arena,_std::default_delete<google::protobuf::Arena>_>::
  ~unique_ptr((unique_ptr<google::protobuf::Arena,_std::default_delete<google::protobuf::Arena>_> *)
              local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_p != &local_20) {
    operator_delete(local_30._M_p,
                    CONCAT71(local_20._M_allocated_capacity._1_7_,local_20._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

TEST_P(SingleArena, CopyConstructEmpty) {
  std::string empty;
  auto arena = GetArena();
  ArenaStringPtr field;
  field.InitExternal(&empty);

  ArenaStringPtr dst(arena.get(), field);
  EXPECT_EQ(dst.Get(), "");
  if (internal::DebugHardenForceCopyDefaultString()) {
    EXPECT_FALSE(dst.IsDefault());
  } else {
    EXPECT_TRUE(dst.IsDefault());
  }
  if (arena == nullptr) dst.Destroy();
  field.Destroy();
}